

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O0

void __thiscall tf::TFProfManager::~TFProfManager(TFProfManager *this)

{
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> SVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  basic_ofstream<char,_std::char_traits<char>_> *pbVar5;
  __shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var6;
  element_type *peVar7;
  ulong local_240;
  size_t i_1;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> serializer;
  size_t i;
  ProfileData data;
  ofstream ofs;
  TFProfManager *this_local;
  
  std::ofstream::ofstream
            (&data.timelines.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,this,0x10);
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&((data.timelines.
                                      super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                      segments.
                                      super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                    )._M_impl.super__Vector_impl_data +
                            (long)&data.timelines.
                                   super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage));
  if (bVar2) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                      (&this->_fpath,".tfp",0xffffffffffffffff);
    if (sVar3 == 0xffffffffffffffff) {
      std::operator<<((ostream *)
                      &data.timelines.
                       super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,"[\n");
      for (local_240 = 0;
          sVar4 = std::
                  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                  ::size(&this->_observers), local_240 < sVar4; local_240 = local_240 + 1) {
        if (local_240 != 0) {
          std::operator<<((ostream *)
                          &data.timelines.
                           super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,',');
        }
        p_Var6 = (__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                    ::operator[](&this->_observers,local_240);
        peVar7 = std::
                 __shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var6);
        TFProfObserver::dump
                  (peVar7,(ostream *)
                          &data.timelines.
                           super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      }
      std::operator<<((ostream *)
                      &data.timelines.
                       super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,"]\n");
    }
    else {
      ProfileData::ProfileData((ProfileData *)&i);
      sVar4 = std::
              vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
              ::size(&this->_observers);
      std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::reserve
                ((vector<tf::Timeline,_std::allocator<tf::Timeline>_> *)&i,sVar4);
      for (serializer._stream = (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
          SVar1._stream = serializer._stream,
          pbVar5 = (basic_ofstream<char,_std::char_traits<char>_> *)
                   std::
                   vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                   ::size(&this->_observers), SVar1._stream < pbVar5;
          serializer._stream = serializer._stream + 1) {
        p_Var6 = (__shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
                    ::operator[](&this->_observers,(size_type)serializer._stream);
        peVar7 = std::
                 __shared_ptr_access<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var6);
        std::vector<tf::Timeline,_std::allocator<tf::Timeline>_>::push_back
                  ((vector<tf::Timeline,_std::allocator<tf::Timeline>_> *)&i,&peVar7->_timeline);
      }
      Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::Serializer
                ((Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)&i_1,
                 (basic_ofstream<char,_std::char_traits<char>_> *)
                 &data.timelines.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      Serializer<std::ofstream,long>::operator()
                ((Serializer<std::ofstream,long> *)&i_1,(ProfileData *)&i);
      ProfileData::~ProfileData((ProfileData *)&i);
    }
  }
  std::ofstream::~ofstream
            (&data.timelines.super__Vector_base<tf::Timeline,_std::allocator<tf::Timeline>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ::~vector(&this->_observers);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

inline TFProfManager::~TFProfManager() {
  std::ofstream ofs(_fpath);
  if(ofs) {
    // .tfp
    if(_fpath.rfind(".tfp") != std::string::npos) {
      ProfileData data;
      data.timelines.reserve(_observers.size());
      for(size_t i=0; i<_observers.size(); ++i) {
        data.timelines.push_back(std::move(_observers[i]->_timeline));
      }
      Serializer<std::ofstream> serializer(ofs);
      serializer(data);
    }
    // .json
    else {
      ofs << "[\n";
      for(size_t i=0; i<_observers.size(); ++i) {
        if(i) ofs << ',';
        _observers[i]->dump(ofs);
      }
      ofs << "]\n";
    }
  }
}